

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O3

void __thiscall
spdlog::details::short_level_formatter::format
          (short_level_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  char *__s;
  size_t wrapped_size;
  value_type *buf_ptr;
  scoped_pad p;
  scoped_pad sStack_48;
  
  __s = *(char **)(level::short_level_names + (ulong)msg->level * 8);
  wrapped_size = strlen(__s);
  scoped_pad::scoped_pad(&sStack_48,wrapped_size,&(this->super_flag_formatter).padinfo_,dest);
  fmt::v5::internal::basic_buffer<char>::append<char>
            (&dest->super_basic_buffer<char>,__s,__s + wrapped_size);
  scoped_pad::~scoped_pad(&sStack_48);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        string_view_t level_name{level::to_short_c_str(msg.level)};
        scoped_pad p(level_name, padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }